

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key,secp256k1_scalar *tweak)

{
  bool bVar1;
  secp256k1_gej pt;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_8c0;
  secp256k1_gej local_8a8;
  secp256k1_fe local_828 [8];
  secp256k1_ge local_6e8 [8];
  secp256k1_strauss_point_state local_428;
  
  local_8a8.infinity = key->infinity;
  local_8a8.x.n[0] = (key->x).n[0];
  local_8a8.x.n[1] = (key->x).n[1];
  local_8a8.x.n[2] = (key->x).n[2];
  local_8a8.x.n[3] = (key->x).n[3];
  local_8a8.x.n[4] = (key->x).n[4];
  local_8a8.y.n[0] = (key->y).n[0];
  local_8a8.y.n[1] = (key->y).n[1];
  local_8a8.y.n[2] = (key->y).n[2];
  local_8a8.y.n[3] = (key->y).n[3];
  local_8a8.y.n[4] = (key->y).n[4];
  local_8a8.z.n[0] = 1;
  local_8a8.z.n[1] = 0;
  local_8a8.z.n[2] = 0;
  local_8a8.z.n[3] = 0;
  local_8a8.z.n[4] = 0;
  local_8c0.aux = local_828;
  local_8c0.pre_a = local_6e8;
  local_8c0.ps = &local_428;
  secp256k1_ecmult_strauss_wnaf(&local_8c0,&local_8a8,1,&local_8a8,&secp256k1_scalar_one,tweak);
  bVar1 = local_8a8.infinity == 0;
  if (bVar1) {
    secp256k1_ge_set_gej(key,&local_8a8);
  }
  return (uint)bVar1;
}

Assistant:

static int secp256k1_eckey_pubkey_tweak_add(secp256k1_ge *key, const secp256k1_scalar *tweak) {
    secp256k1_gej pt;
    secp256k1_gej_set_ge(&pt, key);
    secp256k1_ecmult(&pt, &pt, &secp256k1_scalar_one, tweak);

    if (secp256k1_gej_is_infinity(&pt)) {
        return 0;
    }
    secp256k1_ge_set_gej(key, &pt);
    return 1;
}